

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeViewPrivate::paintAlternatingRowColors
          (QTreeViewPrivate *this,QPainter *painter,QStyleOptionViewItem *option,int y,int bottom)

{
  int iVar1;
  QTreeView *pQVar2;
  QStyle *pQVar3;
  int in_ECX;
  QRect *in_RDX;
  undefined8 in_RSI;
  QTreeViewPrivate *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int rowHeight;
  QTreeView *q;
  QWidget *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff88;
  QAbstractItemDelegate *in_stack_ffffffffffffff90;
  QRect *in_stack_ffffffffffffff98;
  int local_54;
  int local_44;
  undefined1 local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  if (((in_RDI->super_QAbstractItemViewPrivate).alternatingColors & 1U) != 0) {
    pQVar3 = QWidget::style(in_stack_ffffffffffffff78);
    iVar1 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x54,in_RDX,pQVar2,0);
    if (iVar1 != 0) {
      local_54 = in_RDI->defaultItemHeight;
      local_44 = in_ECX;
      if (local_54 < 1) {
        in_stack_ffffffffffffff90 =
             QPointer<QAbstractItemDelegate>::operator->
                       ((QPointer<QAbstractItemDelegate> *)0x8f5632);
        in_stack_ffffffffffffff98 = in_RDX;
        QModelIndex::QModelIndex((QModelIndex *)0x8f564b);
        local_10 = (**(code **)(*(long *)in_stack_ffffffffffffff90 + 0x68))
                             (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,local_28);
        local_54 = QSize::height((QSize *)0x8f566f);
        if (local_54 < 1) goto LAB_008f574b;
      }
      for (; local_44 <= in_R8D; local_44 = local_54 + local_44) {
        iVar1 = local_44;
        QWidget::width((QWidget *)0x8f56b8);
        QRect::setRect(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (int)in_stack_ffffffffffffff90,iVar1,in_stack_ffffffffffffff88);
        QFlags<QStyleOptionViewItem::ViewItemFeature>::setFlag
                  ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_RDI,
                   (ViewItemFeature)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
        in_RDI->current = in_RDI->current + 1;
        pQVar3 = QWidget::style(in_stack_ffffffffffffff78);
        (**(code **)(*(long *)pQVar3 + 0xb0))(pQVar3,0x2d,in_RDX,in_RSI,pQVar2);
      }
    }
  }
LAB_008f574b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::paintAlternatingRowColors(QPainter *painter, QStyleOptionViewItem *option, int y, int bottom) const
{
    Q_Q(const QTreeView);
    if (!alternatingColors || !q->style()->styleHint(QStyle::SH_ItemView_PaintAlternatingRowColorsForEmptyArea, option, q))
        return;
    int rowHeight = defaultItemHeight;
    if (rowHeight <= 0) {
        rowHeight = itemDelegate->sizeHint(*option, QModelIndex()).height();
        if (rowHeight <= 0)
            return;
    }
    while (y <= bottom) {
        option->rect.setRect(0, y, viewport->width(), rowHeight);
        option->features.setFlag(QStyleOptionViewItem::Alternate, current & 1);
        ++current;
        q->style()->drawPrimitive(QStyle::PE_PanelItemViewRow, option, painter, q);
        y += rowHeight;
    }
}